

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

PMAPPED_VIEW_LIST MAPGetViewForAddress(LPCVOID lpAddress)

{
  PMAPPED_VIEW_LIST in_RAX;
  PMAPPED_VIEW_LIST p_Var1;
  PMAPPED_VIEW_LIST pView;
  LIST_ENTRY *pLVar2;
  
  if (lpAddress != (LPCVOID)0x0) {
    pLVar2 = &MappedViewList;
    do {
      pLVar2 = (((PMAPPED_VIEW_LIST)pLVar2)->Link).Flink;
      p_Var1 = in_RAX;
      if (pLVar2 == &MappedViewList) break;
      p_Var1 = (PMAPPED_VIEW_LIST)pLVar2;
    } while (((PMAPPED_VIEW_LIST)pLVar2)->lpAddress != lpAddress);
    if (pLVar2 != &MappedViewList) {
      return p_Var1;
    }
  }
  if (PAL_InitializeChakraCoreCalled) {
    return (PMAPPED_VIEW_LIST)0x0;
  }
  abort();
}

Assistant:

static PMAPPED_VIEW_LIST MAPGetViewForAddress( LPCVOID lpAddress )
{       
    if ( NULL == lpAddress )
    {
        ERROR( "lpAddress cannot be NULL\n" );
        return NULL;
    }

    for(LIST_ENTRY *pLink = MappedViewList.Flink;
        pLink != &MappedViewList;
        pLink = pLink->Flink)
    {
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

        if (pView->lpAddress == lpAddress)
        {
            return pView;
        }
    }
            
    WARN( "No match found.\n" );
    
    return NULL;
}